

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtw_stb_image.h
# Opt level: O2

void __thiscall rtw_image::convert_to_bytes(rtw_image *this)

{
  float fVar1;
  float *pfVar2;
  int iVar3;
  uchar *puVar4;
  uchar uVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = this->image_height * this->image_width * this->bytes_per_pixel;
  lVar7 = 0;
  iVar3 = -1;
  if (-1 < iVar6) {
    iVar3 = iVar6;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  puVar4 = (uchar *)operator_new__((long)iVar3);
  this->bdata = puVar4;
  pfVar2 = this->fdata;
  for (; iVar6 != (int)lVar7; lVar7 = lVar7 + 1) {
    fVar1 = pfVar2[lVar7];
    if (fVar1 <= 0.0) {
      uVar5 = '\0';
    }
    else {
      uVar5 = 0xff;
      if (fVar1 < 1.0) {
        uVar5 = (uchar)(int)(fVar1 * 256.0);
      }
    }
    puVar4[lVar7] = uVar5;
  }
  return;
}

Assistant:

void convert_to_bytes() {
        // Convert the linear floating point pixel data to bytes, storing the resulting byte
        // data in the `bdata` member.

        int total_bytes = image_width * image_height * bytes_per_pixel;
        bdata = new unsigned char[total_bytes];

        // Iterate through all pixel components, converting from [0.0, 1.0] float values to
        // unsigned [0, 255] byte values.

        auto *bptr = bdata;
        auto *fptr = fdata;
        for (auto i=0; i < total_bytes; i++, fptr++, bptr++)
            *bptr = float_to_byte(*fptr);
    }